

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O3

int32_t lj_str_cmp(GCstr *a,GCstr *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = a->len;
  uVar2 = b->len;
  uVar3 = uVar2;
  if (uVar1 < uVar2) {
    uVar3 = uVar1;
  }
  if (uVar3 != 0) {
    iVar4 = uVar3 * -8;
    uVar7 = 0;
    do {
      iVar4 = iVar4 + 0x20;
      uVar6 = *(uint *)((long)&a[1].nextgc.gcptr64 + uVar7);
      uVar5 = *(uint *)((long)&b[1].nextgc.gcptr64 + uVar7);
      if (uVar6 != uVar5) {
        uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        if (-4 < (int)((int)uVar7 - uVar3)) {
          uVar6 = uVar6 >> ((byte)iVar4 & 0x1f);
          uVar5 = uVar5 >> ((byte)iVar4 & 0x1f);
          if (uVar6 == uVar5) {
            return uVar1 - uVar2;
          }
        }
        return -(uint)(uVar6 < uVar5) | 1;
      }
      uVar6 = (int)uVar7 + 4;
      uVar7 = (ulong)uVar6;
    } while (uVar6 < uVar3);
  }
  return uVar1 - uVar2;
}

Assistant:

int32_t LJ_FASTCALL lj_str_cmp(GCstr *a, GCstr *b)
{
  MSize i, n = a->len > b->len ? b->len : a->len;
#ifdef LUAJIT_USE_VALGRIND
  for (i = 0; i < n; i++) {
    uint8_t va = *(const uint8_t *)(strdata(a)+i);
    uint8_t vb = *(const uint8_t *)(strdata(b)+i);
    if (va != vb) {
        return va < vb ? -1 : 1;
    }
  }
#else
  for (i = 0; i < n; i += 4) {
    /* Note: innocuous access up to end of string + 3. */
    uint32_t va = *(const uint32_t *)(strdata(a)+i);
    uint32_t vb = *(const uint32_t *)(strdata(b)+i);
    if (va != vb) {
#if LJ_LE
      va = lj_bswap(va); vb = lj_bswap(vb);
#endif
      i -= n;
      if ((int32_t)i >= -3) {
	va >>= 32+(i<<3); vb >>= 32+(i<<3);
	if (va == vb) break;
      }
      return va < vb ? -1 : 1;
    }
  }
#endif
  return (int32_t)(a->len - b->len);
}